

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O3

void __thiscall fizplex::Simplex::Simplex(Simplex *this,LP *_lp,int print_level_)

{
  iterator iVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long local_30;
  
  this->lp = _lp;
  this->print_level = print_level_;
  (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = ColMatrix::col_count(&_lp->A);
  sVar3 = ColMatrix::row_count(&this->lp->A);
  DVector::DVector(&this->x,sVar3 + sVar2);
  sVar2 = ColMatrix::col_count(&this->lp->A);
  sVar3 = ColMatrix::row_count(&this->lp->A);
  DVector::DVector(&this->c,sVar3 + sVar2);
  this->z = INFINITY;
  this->result = Unsolved;
  this->phase = One;
  sVar2 = ColMatrix::col_count(&this->lp->A);
  LP::add_logicals(this->lp);
  local_30 = 0;
  if (sVar2 != 0) {
    do {
      iVar1._M_current =
           (this->non_basic_indices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->non_basic_indices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->non_basic_indices,
                   iVar1,&local_30);
      }
      else {
        *iVar1._M_current = local_30;
        (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_30 = local_30 + 1;
    } while (local_30 < sVar2);
  }
  while( true ) {
    local_30 = sVar2;
    sVar3 = ColMatrix::col_count(&this->lp->A);
    if (sVar3 <= sVar2) break;
    iVar1._M_current =
         (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->basic_indices,iVar1,
                 &local_30);
    }
    else {
      *iVar1._M_current = local_30;
      (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    sVar2 = local_30 + 1;
  }
  return;
}

Assistant:

Simplex::Simplex(LP &_lp, int print_level_)
    : lp(_lp), print_level(print_level_),
      x(lp.A.col_count() + lp.A.row_count()),
      c(lp.A.col_count() + lp.A.row_count()) {
  const size_t structural_count = lp.A.col_count();
  lp.add_logicals();
  for (size_t i = 0; i < structural_count; i++)
    non_basic_indices.push_back(i);
  for (size_t i = structural_count; i < lp.A.col_count(); i++)
    basic_indices.push_back(i);
}